

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O1

int32_t __thiscall cppnet::BufferQueue::MoveWritePt(BufferQueue *this,int32_t len)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  BufferBlock *__tmp_1;
  element_type *peVar5;
  BufferBlock *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  int iVar8;
  bool bVar9;
  
  peVar7 = (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (len < 0) {
    if (peVar7 != (element_type *)0x0) {
      iVar8 = 0;
      do {
        iVar4 = (*(peVar7->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                          (peVar7,(ulong)(uint)(iVar8 + len));
        peVar7 = (this->_buffer_list)._head.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (this->_buffer_list)._head.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        iVar8 = iVar8 + iVar4;
        peVar2 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        if (peVar2 == peVar7 || SBORROW4(iVar8,-len) == iVar8 + len < 0) break;
        peVar7 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (peVar7->super_ListSlot<cppnet::BufferBlock>)._prev.
                 super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar4 = p_Var6->_M_use_count;
          do {
            if (iVar4 == 0) {
              p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar1 = p_Var6->_M_use_count;
            bVar9 = iVar4 == iVar1;
            if (bVar9) {
              p_Var6->_M_use_count = iVar4 + 1;
              iVar1 = iVar4;
            }
            iVar4 = iVar1;
            UNLOCK();
          } while (!bVar9);
        }
        if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar9 = true;
        }
        else {
          bVar9 = p_Var6->_M_use_count == 0;
        }
        if (bVar9) {
          peVar5 = (element_type *)0x0;
        }
        else {
          peVar5 = (peVar7->super_ListSlot<cppnet::BufferBlock>)._prev.
                   super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar5;
        p_Var3 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var6;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        peVar7 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      } while (peVar7 != (element_type *)0x0);
      goto LAB_00111fd0;
    }
  }
  else if (peVar7 != (element_type *)0x0) {
    iVar8 = 0;
    do {
      iVar4 = (*(peVar7->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                        (peVar7,(ulong)(uint)(len - iVar8));
      peVar7 = (this->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = (this->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      iVar8 = iVar8 + iVar4;
      peVar2 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if (peVar2 == peVar7 || len <= iVar8) break;
      peVar7 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (peVar7->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = (peVar7->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      p_Var3 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var6;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      peVar7 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    } while (peVar7 != (element_type *)0x0);
    goto LAB_00111fd0;
  }
  iVar8 = 0;
LAB_00111fd0:
  this->_can_read_length = this->_can_read_length + iVar8;
  return iVar8;
}

Assistant:

int32_t BufferQueue::MoveWritePt(int32_t len) {
    int32_t total_write_len = 0;
    if (len >= 0) {
        while (_buffer_write) {
            total_write_len += _buffer_write->MoveWritePt(len - total_write_len);
            if (_buffer_write == _buffer_list.GetTail() || len <= total_write_len) {
                break;
            }
            _buffer_write = _buffer_write->GetNext();
        }

    } else {
        while (_buffer_write) {
            total_write_len += _buffer_write->MoveWritePt(len + total_write_len);
            if (_buffer_write == _buffer_list.GetHead() || -len <= total_write_len) {
                break;
            }
            _buffer_write = _buffer_write->GetPrev();
        }
    }
    _can_read_length += total_write_len;
    return total_write_len;
}